

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O3

interpolator * interp_create(uint taps,uint factor,uint channels)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong __nmemb;
  interpolator *__ptr;
  interp_filter *__ptr_00;
  void *pvVar4;
  void *pvVar5;
  float **__ptr_01;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  uVar8 = (ulong)taps;
  __ptr = (interpolator *)calloc(1,0x28);
  if (__ptr != (interpolator *)0x0) {
    __ptr->taps = 0x31;
    __ptr->factor = taps;
    __ptr->channels = factor;
    uVar2 = (ulong)(taps + 0x30) / (ulong)taps;
    __ptr->delay = (uint)uVar2;
    __ptr_00 = (interp_filter *)calloc(uVar8,0x18);
    __ptr->filter = __ptr_00;
    if (__ptr_00 != (interp_filter *)0x0) {
      lVar3 = (ulong)(taps + (taps == 0)) * 0x18;
      lVar9 = 0;
      do {
        pvVar4 = calloc(uVar2,4);
        *(void **)((long)&__ptr_00->index + lVar9) = pvVar4;
        pvVar5 = calloc(uVar2,8);
        *(void **)((long)&__ptr_00->coeff + lVar9) = pvVar5;
        if ((pvVar4 == (void *)0x0) || (pvVar5 == (void *)0x0)) goto LAB_001080a5;
        lVar9 = lVar9 + 0x18;
      } while (lVar3 != lVar9);
      __nmemb = (ulong)factor;
      __ptr_01 = (float **)calloc(__nmemb,8);
      __ptr->z = __ptr_01;
      if (__ptr_01 != (float **)0x0) {
        if (factor == 0) {
LAB_00107f64:
          dVar13 = 0.0;
          iVar10 = -0x18;
          do {
            dVar11 = 1.0;
            if (1e-06 < ABS((double)iVar10)) {
              dVar12 = ((double)iVar10 * 3.141592653589793) / (double)uVar8;
              dVar11 = sin(dVar12);
              dVar11 = dVar11 / dVar12;
            }
            dVar12 = cos((dVar13 * 6.283185307179586) / 48.0);
            dVar11 = (1.0 - dVar12) * 0.5 * dVar11;
            if (1e-06 < ABS(dVar11)) {
              uVar2 = (ulong)(iVar10 + 0x18U) % uVar8;
              uVar1 = __ptr_00[uVar2].count;
              __ptr_00[uVar2].count = uVar1 + 1;
              __ptr_00[uVar2].coeff[uVar1] = dVar11;
              __ptr_00[uVar2].index[uVar1] = (iVar10 + 0x18U) / taps;
            }
            dVar13 = dVar13 + 1.0;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x19);
          return __ptr;
        }
        uVar7 = 0;
LAB_00107f41:
        pfVar6 = (float *)calloc(uVar2,4);
        __ptr_01[uVar7] = pfVar6;
        if (pfVar6 != (float *)0x0) goto code_r0x00107f5c;
        uVar8 = 0;
        do {
          free(__ptr_01[uVar8]);
          uVar8 = uVar8 + 1;
        } while (__nmemb != uVar8);
        free(__ptr_01);
      }
LAB_001080a5:
      lVar9 = 0;
      do {
        free(*(void **)((long)&__ptr_00->index + lVar9));
        free(*(void **)((long)&__ptr_00->coeff + lVar9));
        lVar9 = lVar9 + 0x18;
      } while (lVar3 != lVar9);
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (interpolator *)0x0;
code_r0x00107f5c:
  uVar7 = uVar7 + 1;
  if (__nmemb == uVar7) goto LAB_00107f64;
  goto LAB_00107f41;
}

Assistant:

static interpolator*
interp_create(unsigned int taps, unsigned int factor, unsigned int channels) {
  int errcode; /* unused */
  interpolator* interp;
  unsigned int j;

  interp = (interpolator*) calloc(1, sizeof(interpolator));
  CHECK_ERROR(!interp, 0, exit);

  interp->taps = taps;
  interp->factor = factor;
  interp->channels = channels;
  interp->delay = (interp->taps + interp->factor - 1) / interp->factor;

  /* Initialize the filter memory
   * One subfilter per interpolation factor. */
  interp->filter =
      (interp_filter*) calloc(interp->factor, sizeof(*interp->filter));
  CHECK_ERROR(!interp->filter, 0, free_interp);

  for (j = 0; j < interp->factor; j++) {
    interp->filter[j].index =
        (unsigned int*) calloc(interp->delay, sizeof(unsigned int));
    interp->filter[j].coeff = (double*) calloc(interp->delay, sizeof(double));
    CHECK_ERROR(!interp->filter[j].index || !interp->filter[j].coeff, 0,
                free_filter_index_coeff);
  }

  /* One delay buffer per channel. */
  interp->z = (float**) calloc(interp->channels, sizeof(float*));
  CHECK_ERROR(!interp->z, 0, free_filter_index_coeff);
  for (j = 0; j < interp->channels; j++) {
    interp->z[j] = (float*) calloc(interp->delay, sizeof(float));
    CHECK_ERROR(!interp->z[j], 0, free_filter_z);
  }

  /* Calculate the filter coefficients */
  for (j = 0; j < interp->taps; j++) {
    /* Calculate sinc */
    double m = (double) j - (double) (interp->taps - 1) / 2.0;
    double c = 1.0;
    if (fabs(m) > ALMOST_ZERO) {
      c = sin(m * M_PI / interp->factor) / (m * M_PI / interp->factor);
    }
    /* Apply Hanning window */
    c *= 0.5 * (1 - cos(2 * M_PI * j / (interp->taps - 1)));

    if (fabs(c) > ALMOST_ZERO) { /* Ignore any zero coeffs. */
      /* Put the coefficient into the correct subfilter */
      unsigned int f = j % interp->factor;
      unsigned int t = interp->filter[f].count++;
      interp->filter[f].coeff[t] = c;
      interp->filter[f].index[t] = j / interp->factor;
    }
  }
  return interp;

free_filter_z:
  for (j = 0; j < interp->channels; j++) {
    free(interp->z[j]);
  }
  free(interp->z);
free_filter_index_coeff:
  for (j = 0; j < interp->factor; j++) {
    free(interp->filter[j].index);
    free(interp->filter[j].coeff);
  }
  free(interp->filter);
free_interp:
  free(interp);
exit:
  return NULL;
}